

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
::AnalysisChecker(AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
                  *this,FiniteIntPowersetLattice *lattice,LivenessTransferFunction *txfn,
                 string *latticeName,string *txfnName,uint64_t latticeElementSeed,Name funcName)

{
  uint64_t latticeElementSeed_local;
  string *txfnName_local;
  string *latticeName_local;
  LivenessTransferFunction *txfn_local;
  FiniteIntPowersetLattice *lattice_local;
  AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
  *this_local;
  
  this->lattice = lattice;
  this->txfn = txfn;
  std::__cxx11::string::string((string *)&this->latticeName,(string *)latticeName);
  std::__cxx11::string::string((string *)&this->txfnName,(string *)txfnName);
  this->latticeElementSeed = latticeElementSeed;
  (this->funcName).super_IString.str._M_len = funcName.super_IString.str._M_len;
  (this->funcName).super_IString.str._M_str = funcName.super_IString.str._M_str;
  return;
}

Assistant:

AnalysisChecker(L& lattice,
                  TxFn& txfn,
                  std::string latticeName,
                  std::string txfnName,
                  uint64_t latticeElementSeed,
                  Name funcName)
    : lattice(lattice), txfn(txfn), latticeName(latticeName),
      txfnName(txfnName), latticeElementSeed(latticeElementSeed),
      funcName(funcName) {}